

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O2

void ssh2_transport_notify_auth_done(PacketProtocolLayer *ppl)

{
  if (ppl->vt == &ssh2_transport_vtable) {
    ppl[-0xb].vt = (PacketProtocolLayerVtable *)0x0;
    *(undefined4 *)&ppl[-0xb].bpp = 4;
    queue_idempotent_callback(&ppl->ic_process_queue);
    return;
  }
  __assert_fail("ppl->vt == &ssh2_transport_vtable",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/transport2.c"
                ,0x807,"void ssh2_transport_notify_auth_done(PacketProtocolLayer *)");
}

Assistant:

void ssh2_transport_notify_auth_done(PacketProtocolLayer *ppl)
{
    struct ssh2_transport_state *s;

    assert(ppl->vt == &ssh2_transport_vtable);
    s = container_of(ppl, struct ssh2_transport_state, ppl);

    s->rekey_reason = NULL;            /* will be filled in later */
    s->rekey_class = RK_POST_USERAUTH;
    queue_idempotent_callback(&s->ppl.ic_process_queue);
}